

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

void __thiscall Glucose::vec<int>::capacity(vec<int> *this,int min_cap)

{
  uint uVar1;
  int *piVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = this->cap;
  if ((int)uVar1 < min_cap) {
    uVar5 = (min_cap - uVar1) + 1 & 0xfffffffe;
    uVar4 = ((int)uVar1 >> 1 & 0xfffffffeU) + 2;
    if ((int)uVar4 <= (int)uVar5) {
      uVar4 = uVar5;
    }
    if ((int)(uVar1 ^ 0x7fffffff) < (int)uVar4) {
LAB_0011397d:
      uVar3 = __cxa_allocate_exception(1);
      __cxa_throw(uVar3,&OutOfMemoryException::typeinfo,0);
    }
    this->cap = uVar4 + uVar1;
    piVar2 = (int *)realloc(this->data,(long)(int)(uVar4 + uVar1) << 2);
    this->data = piVar2;
    if (piVar2 == (int *)0x0) {
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) goto LAB_0011397d;
    }
  }
  return;
}

Assistant:

void vec<T>::capacity(int min_cap) {
    if (cap >= min_cap) return;
    int add = imax((min_cap - cap + 1) & ~1, ((cap >> 1) + 2) & ~1);   // NOTE: grow by approximately 3/2
    if (add > INT_MAX - cap || ((data = (T*)::realloc(data, (cap += add) * sizeof(T))) == NULL) && errno == ENOMEM)
        throw OutOfMemoryException();
 }